

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicBoard.cpp
# Opt level: O3

void __thiscall
GraphicBoard::createTiles(GraphicBoard *this,QImage *image,size_t boardSize,size_t tileSize)

{
  bool bVar1;
  ulong uVar2;
  vector<QImage,_std::allocator<QImage>_> *this_00;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  size_t local_50;
  QRect local_48;
  
  uVar4 = tileSize * boardSize;
  this_00 = &this->images;
  local_50 = tileSize;
  std::vector<QImage,_std::allocator<QImage>_>::reserve(this_00,boardSize * boardSize);
  if (uVar4 != 0) {
    uVar3 = 0;
    do {
      uVar2 = 0;
      uVar5 = tileSize & 0xffffffff;
      do {
        if (uVar2 == uVar4 - tileSize && uVar3 == uVar4 - tileSize) break;
        QImage::copy(&local_48);
        std::vector<QImage,_std::allocator<QImage>_>::emplace_back<QImage>
                  (this_00,(QImage *)&local_48);
        QImage::~QImage((QImage *)&local_48);
        bVar1 = uVar5 < uVar4;
        uVar2 = uVar5;
        uVar5 = (ulong)(uint)((int)uVar5 + (int)tileSize);
      } while (bVar1);
      uVar3 = (ulong)(uint)((int)uVar3 + (int)tileSize);
    } while (uVar3 < uVar4);
  }
  local_48.x1 = 4;
  std::vector<QImage,std::allocator<QImage>>::
  emplace_back<unsigned_long&,unsigned_long&,QImage::Format>
            ((vector<QImage,std::allocator<QImage>> *)this_00,&local_50,&local_50,
             (Format *)&local_48);
  QImage::fill((int)(this->images).super__Vector_base<QImage,_std::allocator<QImage>_>._M_impl.
                    super__Vector_impl_data._M_finish - (darkCyan|green));
  Message::putMessage(GRAPHIC_LOAD_OK,boardSize);
  return;
}

Assistant:

void GraphicBoard::createTiles( QImage& image, size_t boardSize, size_t tileSize )
{
    size_t pictureSize = boardSize * tileSize;
    images.reserve( boardSize * boardSize );

    for ( uint yPos = 0; yPos < pictureSize; yPos += tileSize )
    {
        for ( uint xPos = 0; xPos < pictureSize; xPos += tileSize )
        {
            if (( yPos == pictureSize - tileSize ) && ( xPos == pictureSize - tileSize ))
            {
                break;
            }
            images.emplace_back( image.copy( xPos, yPos, tileSize, tileSize ));
        }
    }

    images.emplace_back( tileSize, tileSize, QImage::Format_RGB32 );
    images.back().fill( Qt::GlobalColor::white );
    Message::putMessage( Result::GRAPHIC_LOAD_OK, boardSize );
}